

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::AssertionResult::getExpressionInMacro_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResult *this)

{
  bool bVar1;
  string local_40;
  undefined1 local_19;
  AssertionResult *local_18;
  AssertionResult *this_local;
  string *expr;
  
  local_19 = 0;
  local_18 = this;
  this_local = (AssertionResult *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = StringRef::empty((StringRef *)this);
  if (bVar1) {
    StringRef::operator_cast_to_string(&local_40,&(this->m_info).capturedExpression);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    StringRef::size((StringRef *)this);
    StringRef::size(&(this->m_info).capturedExpression);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    Catch::operator+=(__return_storage_ptr__,(StringRef *)this);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"( ");
    Catch::operator+=(__return_storage_ptr__,&(this->m_info).capturedExpression);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," )");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getExpressionInMacro() const {
        std::string expr;
        if( m_info.macroName.empty() )
            expr = static_cast<std::string>(m_info.capturedExpression);
        else {
            expr.reserve( m_info.macroName.size() + m_info.capturedExpression.size() + 4 );
            expr += m_info.macroName;
            expr += "( ";
            expr += m_info.capturedExpression;
            expr += " )";
        }
        return expr;
    }